

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O1

void __thiscall cppcms::widgets::numeric<int>::load(numeric<int> *this,context *context)

{
  char cVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  const_iterator cVar2;
  bool bVar3;
  istringstream ss;
  locale local_1b0 [8];
  locale local_1a8 [8];
  key_type local_1a0;
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  cppcms::widgets::base_widget::pre_load
            ((context *)(&this->super_base_html_input + *(long *)(*(long *)this + -0x18)));
  (this->loaded_string_)._M_string_length = 0;
  *(this->loaded_string_)._M_dataplus._M_p = '\0';
  cVar1 = (char)this;
  cppcms::widgets::base_widget::set((bool)((char)*(undefined8 *)(*(long *)this + -0x18) + cVar1));
  cppcms::widgets::base_widget::valid((bool)((char)*(undefined8 *)(*(long *)this + -0x18) + cVar1));
  cppcms::http::context::request();
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)cppcms::http::request::post_or_get_abi_cxx11_();
  cppcms::widgets::base_widget::name_abi_cxx11_();
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(this_00,&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if (cVar2._M_node != (_Base_ptr)(this_00 + 8)) {
    std::__cxx11::string::_M_assign((string *)&this->loaded_string_);
    if ((this->loaded_string_)._M_string_length != 0) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&local_1a0,(string *)&this->loaded_string_,_S_in);
      cppcms::http::context::locale();
      std::ios::imbue(local_1a8);
      std::locale::~locale(local_1a8);
      std::locale::~locale(local_1b0);
      std::istream::operator>>((istream *)&local_1a0,&this->value_);
      bVar3 = (bool)(cVar1 + (char)*(undefined8 *)(*(long *)this + -0x18));
      if ((*(uint *)((long)auStack_180 + *(long *)(local_1a0._M_dataplus._M_p + -0x18)) & 7) == 2) {
        cppcms::widgets::base_widget::set(bVar3);
      }
      else {
        cppcms::widgets::base_widget::valid(bVar3);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_1a0);
      std::ios_base::~ios_base(local_128);
    }
  }
  return;
}

Assistant:

virtual void load(http::context &context)
			{
				pre_load(context);

				loaded_string_.clear();

				set(false);
				valid(true);

				http::request::form_type::const_iterator p;
				http::request::form_type const &request=context.request().post_or_get();
				p=request.find(name());
				if(p==request.end()) {
					return;
				}
				else {
					loaded_string_=p->second;
					if(loaded_string_.empty())
						return;

					std::istringstream ss(loaded_string_);
					ss.imbue(context.locale());
					ss>>value_;
					if(ss.fail() || !ss.eof())
						valid(false);
					else
						set(true);
				}
			}